

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O3

Error __thiscall
asmjit::X86FuncArgsContext::markStackArgsReg(X86FuncArgsContext *this,FuncFrameInfo *ffi)

{
  byte bVar1;
  uint extraout_EAX;
  undefined4 uVar2;
  Error EVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  
  if (this->_hasStackArgs != true) {
    return 0;
  }
  if ((ffi->_attributes & 1) != 0) {
    ffi->_stackArgsRegId = '\x05';
    return 0;
  }
  bVar1 = ffi->_stackArgsRegId;
  uVar6 = this->_workData[0].usedRegs;
  if (bVar1 == 0xff) {
    markStackArgsReg();
    EVar3 = 0x35;
    uVar6 = extraout_EAX;
joined_r0x00121508:
    if ((uVar6 & 1) == 0) {
      EVar3 = 0;
    }
    return EVar3;
  }
  if (bVar1 < 0x20) {
    EVar3 = 0x37;
    uVar6 = uVar6 >> (bVar1 & 0x1f);
    goto joined_r0x00121508;
  }
  markStackArgsReg();
  EVar3 = 3;
  cVar5 = (char)uVar6;
  switch(uVar6) {
  case 0x10:
    break;
  case 0x11:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 3) = 1;
    break;
  case 0x12:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 3) = 1;
    this->_workData[0].usedRegs = 0xffffff01;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x02';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x13:
  case 0x14:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 3) = 1;
    this->_workData[0].usedRegs = 0xffff0201;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x06';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x15:
    this->_workData[0].usedRegs = 0xffffff00;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x01';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x16:
    this->_workData[0].usedRegs = 0xffff0200;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x05';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x17:
    this->_workData[0].usedRegs = 0xff010200;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\a';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  default:
    goto switchD_00121531_caseD_18;
  case 0x1d:
  case 0x1e:
  case 0x1f:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 1;
    *(undefined2 *)((long)&this->_workData[0].archRegs + 3) = 0x1002;
    this->_workData[0].argIndex[8] = 199;
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].reserved[1] = '\0';
    this->_workData[0].reserved[2] = '\x01';
    this->_workData[0].reserved[3] = '\x02';
    this->_workData[0].reserved[4] = '\x03';
    this->_workData[0].reserved[5] = '\x04';
    this->_workData[0].reserved[6] = '\x05';
    this->_workData[0].reserved[7] = '\x06';
    this->_workData[0].reserved[8] = '\a';
    this->_workData[0].usedRegs = 0x6010200;
    this->_workData[0].srcRegs = 0xffffff07;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = '\x04';
    this->_workData[0].numSwaps = '\x05';
    this->_workData[0].numStackArgs = '\x06';
    this->_workData[0].reserved[0] = '\a';
    this->_workData[0].argIndex[0xc] = 0xff;
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].argIndex[0x10] = 0xff;
    this->_workData[0].argIndex[0x11] = '\0';
    this->_workData[0].argIndex[0x12] = '\0';
    this->_workData[0].argIndex[0x13] = '\0';
    this->_workData[0].argIndex[0x18] = 0xff;
    this->_workData[0].argIndex[0x19] = '\0';
    this->_workData[0].argIndex[0x1a] = '\0';
    this->_workData[0].argIndex[0x1b] = '\0';
    *(uint *)(this->_workData[0].argIndex + 0x1c) =
         (0xffU >> (cVar5 - 0x1dU & 0x1f)) << (cVar5 - 0x1dU & 0x1f);
    this->_workData[1].archRegs = 0xff;
    goto LAB_001215df;
  case 0x20:
    *(undefined4 *)((long)&this->_workData[0].archRegs + 1) = 0x100a0102;
    *(undefined1 *)((long)&this->_workData[0].workRegs + 1) = 0x20;
    this->_workData[0].argIndex[8] = '\x06';
    this->_workData[0].argIndex[9] = '\x03';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].argIndex[0xc] = '\x0f';
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].usedRegs = 0x9080201;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = 0xff;
    this->_workData[0].numSwaps = 0xff;
    this->_workData[0].numStackArgs = 0xff;
    this->_workData[0].reserved[0] = 0xff;
    this->_workData[0].argIndex[0x18] = 0xf8;
    this->_workData[0].argIndex[0x19] = 0xf0;
    this->_workData[0].argIndex[0x1a] = '\0';
    this->_workData[0].argIndex[0x1b] = '\0';
    uVar2 = 0xffc0;
    lVar4 = 0x3c;
    goto LAB_001216c9;
  case 0x21:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 2;
    *(undefined2 *)((long)&this->_workData[0].archRegs + 3) = 0x1002;
    *(undefined2 *)((long)&this->_workData[0].workRegs + 2) = 0x80;
    this->_workData[0].argIndex[8] = 0xc6;
    this->_workData[0].argIndex[9] = '\x03';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].argIndex[0xc] = 0xff;
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].usedRegs = 0x1020607;
    this->_workData[0].srcRegs = 0xffff0908;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = '\x04';
    this->_workData[0].numSwaps = '\x05';
    this->_workData[0].numStackArgs = '\x06';
    this->_workData[0].reserved[0] = '\a';
    uVar2 = 0xf038;
    goto LAB_001216c4;
  case 0x2d:
  case 0x2e:
  case 0x2f:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 2;
    *(undefined2 *)((long)&this->_workData[0].archRegs + 3) = 0x1002;
    this->_workData[0].argIndex[8] = 199;
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].reserved[1] = '\0';
    this->_workData[0].reserved[2] = '\x01';
    this->_workData[0].reserved[3] = '\x02';
    this->_workData[0].reserved[4] = '\x03';
    this->_workData[0].reserved[5] = '\x04';
    this->_workData[0].reserved[6] = '\x05';
    this->_workData[0].reserved[7] = '\x06';
    this->_workData[0].reserved[8] = '\a';
    this->_workData[0].usedRegs = 0x6010200;
    this->_workData[0].srcRegs = 0xffffff07;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = '\x04';
    this->_workData[0].numSwaps = '\x05';
    this->_workData[0].numStackArgs = '\x06';
    this->_workData[0].reserved[0] = '\a';
    this->_workData[0].argIndex[0xc] = 0xff;
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].argIndex[0x10] = 0xff;
    this->_workData[0].argIndex[0x11] = '\0';
    this->_workData[0].argIndex[0x12] = '\0';
    this->_workData[0].argIndex[0x13] = '\0';
    this->_workData[0].argIndex[0x18] = 0xff;
    this->_workData[0].argIndex[0x19] = 0xff;
    this->_workData[0].argIndex[0x1a] = '\0';
    this->_workData[0].argIndex[0x1b] = '\0';
    *(int *)(this->_workData[0].argIndex + 0x1c) = -1 << (cVar5 - 0x2dU & 0x1f);
    this->_workData[1].archRegs = 0xff;
LAB_001215df:
    uVar2 = 0xff;
    lVar4 = 0x44;
    goto LAB_001216c9;
  }
  *(undefined1 *)&this->_workData[0].workRegs = 4;
  *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 1;
  uVar2 = 0xf8;
LAB_001216c4:
  lVar4 = 0x38;
LAB_001216c9:
  *(undefined4 *)(this->_workData[0].reserved + lVar4 + -0x17) = uVar2;
  *(char *)&this->_workData[0].archRegs = cVar5;
  EVar3 = 0;
switchD_00121531_caseD_18:
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86FuncArgsContext::markStackArgsReg(FuncFrameInfo& ffi) noexcept {
  if (!_hasStackArgs)
    return kErrorOk;

  // Decide which register to use to hold the stack base address.
  if (!ffi.hasPreservedFP()) {
    WorkData& wd = _workData[X86Reg::kKindGp];
    uint32_t saRegId = ffi.getStackArgsRegId();
    uint32_t usedRegs = wd.usedRegs;

    if (saRegId != Globals::kInvalidRegId) {
      // Check if the user chosen SA register doesn't overlap with others.
      // However, it's fine if it overlaps with some 'dstMove' register.
      if (usedRegs & Utils::mask(saRegId))
        return DebugUtils::errored(kErrorOverlappingStackRegWithRegArg);
    }
    else {
      // Initially, pick some clobbered or dirty register that is neither
      // in 'used' and neither in 'dstMove'. That's the safest bet as the
      // register won't collide with anything right now.
      uint32_t regs = wd.workRegs & ~(usedRegs | wd.dstRegs);

      // If that didn't work out pick some register which is not in 'used'.
      if (!regs) regs = wd.workRegs & ~usedRegs;

      // If that didn't work out then we have to make one more register dirty.
      if (!regs) regs = wd.archRegs & ~wd.workRegs;

      // If that didn't work out we can't continue.
      if (ASMJIT_UNLIKELY(!regs))
        return DebugUtils::errored(kErrorNoMorePhysRegs);

      saRegId = Utils::findFirstBit(regs);
      ffi.setStackArgsRegId(saRegId);
    }
  }
  else {
    ffi.setStackArgsRegId(X86Gp::kIdBp);
  }

  return kErrorOk;
}